

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::replaceLaneF64x2
          (Literal *__return_storage_ptr__,Literal *this,Literal *other,uint8_t index)

{
  uint8_t index_local;
  Literal *other_local;
  Literal *this_local;
  
  replace<2,_&wasm::Literal::getLanesF64x2>(__return_storage_ptr__,this,other,index);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::replaceLaneF64x2(const Literal& other, uint8_t index) const {
  return replace<2, &Literal::getLanesF64x2>(*this, other, index);
}